

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::RenderingTwoBoundingCellsProducesSpan(RendererTests *this)

{
  long lVar1;
  pointer psVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int cover;
  uint uVar6;
  int cover_2;
  scanline_mockup sl2;
  scanline_mockup sl1;
  string local_d0;
  pointer local_b0;
  LocationInfo local_a8;
  scanline_mockup local_80;
  scanline_mockup local_58;
  
  local_58.excepted_y = -1000000;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._inprogress = true;
  local_58._current_y = 0x7fffffff;
  local_80.excepted_y = -1000000;
  local_80.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._inprogress = true;
  local_80._current_y = 0x7fffffff;
  uVar6 = 0;
  do {
    iVar5 = *(int *)((long)&DAT_001a1540 + lVar4);
    iVar3 = 0;
    do {
      lVar1 = lVar4;
      lVar4 = lVar1 + 0xc;
      iVar3 = iVar3 + *(int *)((long)&DAT_001a1544 + lVar1);
      uVar6 = uVar6 + *(int *)((long)&DAT_001a1548 + lVar1);
      if (lVar4 == 0x18) break;
    } while (*(int *)((long)&DAT_001a154c + lVar1) == iVar5);
    if (iVar3 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_58,iVar5,uVar6 * 0x200 - iVar3);
      iVar5 = iVar5 + 1;
    }
    if (lVar4 == 0x18) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_a8,&local_d0,0xc2);
      psVar2 = local_58.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((ut *)&DAT_001a0d90,
                 (span (*) [1])
                 local_58.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  *)local_58.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
        operator_delete(local_a8.filename._M_dataplus._M_p);
      }
      local_b0 = psVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      lVar4 = 0;
      uVar6 = 0;
      do {
        iVar5 = *(int *)((long)&DAT_001a1560 + lVar4);
        iVar3 = 0;
        do {
          lVar1 = lVar4;
          lVar4 = lVar1 + 0xc;
          iVar3 = iVar3 + *(int *)((long)&DAT_001a1564 + lVar1);
          uVar6 = uVar6 + *(int *)((long)&DAT_001a1568 + lVar1);
          if (lVar4 == 0x18) break;
        } while (*(int *)((long)&DAT_001a156c + lVar1) == iVar5);
        if (iVar3 != 0) {
          anon_unknown_1::scanline_mockup::add_cell(&local_80,iVar5,uVar6 * 0x200 - iVar3);
          iVar5 = iVar5 + 1;
        }
        if (lVar4 == 0x18) {
          lVar4 = 0;
          uVar6 = 0;
          do {
            iVar5 = *(int *)((long)&DAT_001a1580 + lVar4);
            iVar3 = 0;
            do {
              lVar1 = lVar4;
              lVar4 = lVar1 + 0xc;
              iVar3 = iVar3 + *(int *)((long)&DAT_001a1584 + lVar1);
              uVar6 = uVar6 + *(int *)((long)&DAT_001a1588 + lVar1);
              if (lVar4 == 0x18) break;
            } while (*(int *)((long)&DAT_001a158c + lVar1) == iVar5);
            if (iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_cell(&local_80,iVar5,uVar6 * 0x200 - iVar3);
              iVar5 = iVar5 + 1;
            }
            if (lVar4 == 0x18) {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,
                         "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                         ,"");
              ut::LocationInfo::LocationInfo(&local_a8,&local_d0,0xce);
              psVar2 = local_80.spans_log.
                       super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ut::
              are_equal<agge::tests::(anonymous_namespace)::span,2ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                        ((ut *)&DAT_001a1d70,
                         (span (*) [2])
                         local_80.spans_log.
                         super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                          *)local_80.spans_log.
                            super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
                operator_delete(local_a8.filename._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if (psVar2 != (pointer)0x0) {
                operator_delete(psVar2);
              }
              if (local_b0 != (pointer)0x0) {
                operator_delete(local_b0);
              }
              return;
            }
            iVar3 = *(int *)((long)&DAT_001a158c + lVar1) - iVar5;
            if ((iVar3 != 0) && ((uVar6 & 0x7fffff) != 0)) {
              anon_unknown_1::scanline_mockup::add_span(&local_80,iVar5,iVar3,uVar6 * 0x200);
            }
          } while( true );
        }
        iVar3 = *(int *)((long)&DAT_001a156c + lVar1) - iVar5;
        if ((iVar3 != 0) && ((uVar6 & 0x7fffff) != 0)) {
          anon_unknown_1::scanline_mockup::add_span(&local_80,iVar5,iVar3,uVar6 * 0x200);
        }
      } while( true );
    }
    iVar3 = *(int *)((long)&DAT_001a154c + lVar1) - iVar5;
    if ((iVar3 != 0) && ((uVar6 & 0x7fffff) != 0)) {
      anon_unknown_1::scanline_mockup::add_span(&local_58,iVar5,iVar3,uVar6 * 0x200);
    }
  } while( true );
}

Assistant:

test( RenderingTwoBoundingCellsProducesSpan )
			{
				// INIT
				scanline_mockup sl1, sl2;
				mocks::cell cells1[] = { { 8, 0, 17 }, { 13, 0, -17 }, };
				mocks::cell cells2[] = { { 11, 0, 255 }, { 199, 0, -255 }, };
				mocks::cell cells3[] = { { 1300011, 0, -100 }, { 1302010, 0, 100 }, };

				// ACT
				sweep_scanline<8>(sl1, begin(cells1), end(cells1), bypass_alpha());

				// ASSERT
				span reference1[] = {
					{ 0x7fffffff, 8, 5, 17 * 512 },
				};

				assert_equal(reference1, sl1.spans_log);

				// ACT
				sweep_scanline<8>(sl2, begin(cells2), end(cells2), bypass_alpha());
				sweep_scanline<8>(sl2, begin(cells3), end(cells3), bypass_alpha());

				// ASSERT
				span reference2[] = {
					{ 0x7fffffff, 11, 188, 255 * 512 },
					{ 0x7fffffff, 1300011, 1999, -100 * 512 },
				};

				assert_equal(reference2, sl2.spans_log);
			}